

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O0

void __thiscall irr::io::SNamedPath::SNamedPath(SNamedPath *this,path *p)

{
  string<char> *in_RSI;
  string<char> *in_RDI;
  path *unaff_retaddr;
  
  core::string<char>::string(in_RSI,in_RDI);
  PathToName((SNamedPath *)p,unaff_retaddr);
  return;
}

Assistant:

SNamedPath(const path &p) :
			Path(p), InternalName(PathToName(p))
	{
	}